

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
TargetPropertyNode::Evaluate
          (string *__return_storage_ptr__,TargetPropertyNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagCheckerParent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  PolicyStatus PVar6;
  Result RVar7;
  TargetType TVar8;
  long lVar9;
  char *pcVar10;
  size_t sVar11;
  ostream *poVar12;
  cmGeneratorTarget *pcVar13;
  string *psVar14;
  cmValue cVar15;
  size_type *psVar16;
  char *pcVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  undefined4 uVar19;
  undefined8 extraout_RDX;
  size_type __rlen;
  basic_string_view<char,_std::char_traits<char>_> __str;
  cmGeneratorTarget *target;
  string interfacePropertyName;
  string propertyName;
  string targetName;
  string linkedTargetsContent;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmGeneratorTarget *local_2a8;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  undefined4 local_21c;
  string local_218;
  string local_1f8;
  cmListFileBacktrace local_1d8;
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
       ::propertyNameValidator == '\0') &&
     (iVar5 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                   ::propertyNameValidator), iVar5 != 0)) {
    Evaluate::propertyNameValidator.regmust = (char *)0x0;
    Evaluate::propertyNameValidator.program = (char *)0x0;
    Evaluate::propertyNameValidator.progsize = 0;
    memset(&Evaluate::propertyNameValidator,0,0xaa);
    cmsys::RegularExpression::compile(&Evaluate::propertyNameValidator,"^[A-Za-z0-9_]+$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&Evaluate::propertyNameValidator,
                 &__dso_handle);
    __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                         ::propertyNameValidator);
  }
  local_2a8 = (cmGeneratorTarget *)0x0;
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  local_240._M_string_length = 0;
  local_240.field_2._M_local_buf[0] = '\0';
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  local_280._M_string_length = 0;
  local_280.field_2._M_local_buf[0] = '\0';
  lVar9 = (long)(parameters->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(parameters->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (lVar9 == 1) {
    local_2a8 = context->HeadTarget;
    std::__cxx11::string::_M_assign((string *)&local_280);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&context->SeenTargetProperties,&local_280);
    context->HadHeadSensitiveCondition = true;
    if (local_2a8 == (cmGeneratorTarget *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2a0,
                 "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  It may not be used with add_custom_command or add_custom_target.   Specify the target to read a property from using the $<TARGET_PROPERTY:tgt,prop> signature instead."
                 ,"");
      reportError(context,(string *)local_1a8,&local_2a0);
    }
    else {
LAB_00509702:
      iVar5 = std::__cxx11::string::compare((char *)&local_280);
      if (iVar5 == 0) {
        std::
        _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
        ::_M_insert_unique<cmGeneratorTarget_const*const&>
                  ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                    *)&context->SourceSensitiveTargets,&local_2a8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_string_length ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2a0,
                   "$<TARGET_PROPERTY:...> expression requires a non-empty property name.","");
        reportError(context,(string *)local_1a8,&local_2a0);
      }
      else {
        bVar3 = cmsys::RegularExpression::find
                          (&Evaluate::propertyNameValidator,local_280._M_dataplus._M_p,
                           &Evaluate::propertyNameValidator.regmatch);
        if (bVar3) {
          if (local_2a8 == (cmGeneratorTarget *)0x0) {
            __assert_fail("target",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                          ,0x7ed,
                          "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                         );
          }
          iVar5 = std::__cxx11::string::compare((char *)&local_280);
          if (iVar5 != 0) {
            local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
            local_2a0._M_string_length = 0;
            local_2a0.field_2._M_local_buf[0] = '\0';
            iVar5 = std::__cxx11::string::compare((char *)&local_280);
            if (iVar5 == 0) {
              pcVar10 = "INTERFACE_INCLUDE_DIRECTORIES";
LAB_00509e41:
              std::__cxx11::string::operator=((string *)&local_2a0,pcVar10);
LAB_00509e4b:
              bVar3 = false;
            }
            else {
              pcVar10 = "INTERFACE_INCLUDE_DIRECTORIES";
              iVar5 = std::__cxx11::string::compare((char *)&local_280);
              if (iVar5 != 0) {
                iVar5 = std::__cxx11::string::compare((char *)&local_280);
                if (iVar5 == 0) {
                  pcVar10 = "INTERFACE_SYSTEM_INCLUDE_DIRECTORIES";
                  goto LAB_00509e41;
                }
                pcVar10 = "INTERFACE_SYSTEM_INCLUDE_DIRECTORIES";
                iVar5 = std::__cxx11::string::compare((char *)&local_280);
                if (iVar5 == 0) goto LAB_00509d47;
                iVar5 = std::__cxx11::string::compare((char *)&local_280);
                if (iVar5 == 0) {
                  pcVar10 = "INTERFACE_COMPILE_DEFINITIONS";
                  goto LAB_00509e41;
                }
                pcVar10 = "INTERFACE_COMPILE_DEFINITIONS";
                iVar5 = std::__cxx11::string::compare((char *)&local_280);
                if (iVar5 == 0) goto LAB_00509d47;
                iVar5 = std::__cxx11::string::compare((char *)&local_280);
                if (iVar5 == 0) {
                  pcVar10 = "INTERFACE_COMPILE_OPTIONS";
                  goto LAB_00509e41;
                }
                pcVar10 = "INTERFACE_COMPILE_OPTIONS";
                iVar5 = std::__cxx11::string::compare((char *)&local_280);
                if (iVar5 == 0) goto LAB_00509d47;
                iVar5 = std::__cxx11::string::compare((char *)&local_280);
                if (iVar5 == 0) {
                  pcVar10 = "INTERFACE_AUTOUIC_OPTIONS";
                  goto LAB_00509e41;
                }
                pcVar10 = "INTERFACE_AUTOUIC_OPTIONS";
                iVar5 = std::__cxx11::string::compare((char *)&local_280);
                if (iVar5 == 0) goto LAB_00509d47;
                iVar5 = std::__cxx11::string::compare((char *)&local_280);
                if (iVar5 == 0) {
                  pcVar10 = "INTERFACE_SOURCES";
                  goto LAB_00509e41;
                }
                pcVar10 = "INTERFACE_SOURCES";
                iVar5 = std::__cxx11::string::compare((char *)&local_280);
                if (iVar5 == 0) goto LAB_00509d47;
                iVar5 = std::__cxx11::string::compare((char *)&local_280);
                if (iVar5 == 0) {
                  pcVar10 = "INTERFACE_COMPILE_FEATURES";
                  goto LAB_00509e41;
                }
                pcVar10 = "INTERFACE_COMPILE_FEATURES";
                iVar5 = std::__cxx11::string::compare((char *)&local_280);
                if (iVar5 == 0) goto LAB_00509d47;
                iVar5 = std::__cxx11::string::compare((char *)&local_280);
                if (iVar5 == 0) {
                  pcVar10 = "INTERFACE_LINK_OPTIONS";
                  goto LAB_00509e41;
                }
                pcVar10 = "INTERFACE_LINK_OPTIONS";
                iVar5 = std::__cxx11::string::compare((char *)&local_280);
                if (iVar5 == 0) goto LAB_00509d47;
                iVar5 = std::__cxx11::string::compare((char *)&local_280);
                if (iVar5 == 0) {
                  pcVar10 = "INTERFACE_LINK_DIRECTORIES";
                  goto LAB_00509e41;
                }
                pcVar10 = "INTERFACE_LINK_DIRECTORIES";
                iVar5 = std::__cxx11::string::compare((char *)&local_280);
                if (iVar5 == 0) goto LAB_00509d47;
                iVar5 = std::__cxx11::string::compare((char *)&local_280);
                if (iVar5 == 0) {
                  pcVar10 = "INTERFACE_LINK_DEPENDS";
                  goto LAB_00509e41;
                }
                pcVar10 = "INTERFACE_LINK_DEPENDS";
                iVar5 = std::__cxx11::string::compare((char *)&local_280);
                if (iVar5 == 0) goto LAB_00509d47;
                iVar5 = std::__cxx11::string::compare((char *)&local_280);
                if (iVar5 == 0) {
                  pcVar10 = "INTERFACE_PRECOMPILE_HEADERS";
                  goto LAB_00509e41;
                }
                pcVar10 = "INTERFACE_PRECOMPILE_HEADERS";
                iVar5 = std::__cxx11::string::compare((char *)&local_280);
                if (iVar5 == 0) goto LAB_00509d47;
                local_1a8._0_8_ = local_280._M_string_length;
                local_1a8._8_8_ = local_280._M_dataplus._M_p;
                __str._M_str = "COMPILE_DEFINITIONS_";
                __str._M_len = 0x14;
                iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                  ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,0,
                                   0x14,__str);
                if ((iVar5 == 0) &&
                   (PVar6 = cmLocalGenerator::GetPolicyStatus(context->LG,CMP0043), PVar6 < NEW)) {
                  std::__cxx11::string::operator=
                            ((string *)&local_2a0,"INTERFACE_COMPILE_DEFINITIONS");
                }
                goto LAB_00509e4b;
              }
LAB_00509d47:
              bVar3 = true;
              std::__cxx11::string::operator=((string *)&local_2a0,pcVar10);
            }
            if (((dagCheckerParent == (cmGeneratorExpressionDAGChecker *)0x0) ||
                (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingGenexExpression
                                   (dagCheckerParent), bVar4)) ||
               (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingPICExpression(dagCheckerParent),
               bVar4)) {
LAB_00509e6e:
              uVar19 = 0;
LAB_00509e70:
              pcVar13 = local_2a8;
              if (bVar3) {
                cmGeneratorTarget::EvaluateInterfaceProperty
                          ((string *)local_1a8,local_2a8,&local_280,context,dagCheckerParent,Usage);
                cmGeneratorExpression::StripEmptyListElements
                          (__return_storage_ptr__,(string *)local_1a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._0_8_ != local_198) {
                  operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
                }
              }
              else {
                local_1d8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (context->Backtrace).
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
                local_1d8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi =
                     (context->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                     .TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
                if (local_1d8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_1d8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count =
                         (local_1d8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                          TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_1d8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count =
                         (local_1d8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                          TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                local_21c = uVar19;
                local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1c8,local_280._M_dataplus._M_p,
                           (char *)(local_280._M_string_length + (long)local_280._M_dataplus._M_p));
                cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                          ((cmGeneratorExpressionDAGChecker *)local_1a8,&local_1d8,pcVar13,
                           &local_1c8,content,dagCheckerParent);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                  operator_delete(local_1c8._M_dataplus._M_p,
                                  local_1c8.field_2._M_allocated_capacity + 1);
                }
                if (local_1d8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_1d8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                             TopEntry.
                             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
                RVar7 = cmGeneratorExpressionDAGChecker::Check
                                  ((cmGeneratorExpressionDAGChecker *)local_1a8);
                if (RVar7 == SELF_REFERENCE) {
                  GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_260,content);
                  cmGeneratorExpressionDAGChecker::ReportError
                            ((cmGeneratorExpressionDAGChecker *)local_1a8,context,&local_260);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_260._M_dataplus._M_p != &local_260.field_2) {
                    operator_delete(local_260._M_dataplus._M_p,
                                    CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                             local_260.field_2._M_local_buf[0]) + 1);
                  }
LAB_0050a0fb:
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  __return_storage_ptr__->_M_string_length = 0;
                  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
                }
                else {
                  if (RVar7 == CYCLIC_REFERENCE) goto LAB_0050a0fb;
                  paVar1 = &local_260.field_2;
                  local_260._M_string_length = 0;
                  local_260.field_2._M_local_buf[0] = '\0';
                  local_260._M_dataplus._M_p = (pointer)paVar1;
                  cVar15 = cmGeneratorTarget::GetProperty(local_2a8,&local_280);
                  if (cVar15.Value == (string *)0x0) {
                    if ((char)local_21c == '\0') goto LAB_0050a1fc;
                    paVar18 = &__return_storage_ptr__->field_2;
                    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar18;
                    psVar16 = &__return_storage_ptr__->_M_string_length;
LAB_0050a3d7:
                    *psVar16 = 0;
                    paVar18->_M_local_buf[0] = '\0';
                  }
                  else {
                    std::__cxx11::string::_M_assign((string *)&local_260);
LAB_0050a1fc:
                    if (((cVar15.Value != (string *)0x0) ||
                        (bVar3 = cmGeneratorTarget::IsImported(local_2a8), bVar3)) ||
                       (TVar8 = cmGeneratorTarget::GetType(local_2a8), TVar8 == INTERFACE_LIBRARY))
                    {
LAB_0050a222:
                      bVar3 = cmGeneratorTarget::IsImported(local_2a8);
                      if ((dagCheckerParent == (cmGeneratorExpressionDAGChecker *)0x0 || bVar3) ||
                         (bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                            (dagCheckerParent,(cmGeneratorTarget *)0x0,ANY), bVar3))
                      {
LAB_0050a24a:
                        if (local_2a0._M_string_length != 0) {
                          cmGeneratorExpressionNode::EvaluateDependentExpression
                                    (&local_218,&local_260,context->LG,context,local_2a8,
                                     (cmGeneratorExpressionDAGChecker *)local_1a8,local_2a8);
                          cmGeneratorExpression::StripEmptyListElements(&local_1f8,&local_218);
                          std::__cxx11::string::operator=((string *)&local_260,(string *)&local_1f8)
                          ;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                            operator_delete(local_1f8._M_dataplus._M_p,
                                            local_1f8.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_218._M_dataplus._M_p != &local_218.field_2) {
                            operator_delete(local_218._M_dataplus._M_p,
                                            local_218.field_2._M_allocated_capacity + 1);
                          }
                          getLinkedTargetsContent
                                    (&local_1f8,local_2a8,&local_2a0,context,
                                     (cmGeneratorExpressionDAGChecker *)local_1a8);
                          if (local_1f8._M_string_length != 0) {
                            pcVar10 = ";";
                            if (local_260._M_string_length == 0) {
                              pcVar10 = "";
                            }
                            std::operator+(&local_218,pcVar10,&local_1f8);
                            std::__cxx11::string::_M_append
                                      ((char *)&local_260,(ulong)local_218._M_dataplus._M_p);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_218._M_dataplus._M_p != &local_218.field_2) {
                              operator_delete(local_218._M_dataplus._M_p,
                                              local_218.field_2._M_allocated_capacity + 1);
                            }
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                            operator_delete(local_1f8._M_dataplus._M_p,
                                            local_1f8.field_2._M_allocated_capacity + 1);
                          }
                        }
                        (__return_storage_ptr__->_M_dataplus)._M_p =
                             (pointer)&__return_storage_ptr__->field_2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_260._M_dataplus._M_p == paVar1) {
                          (__return_storage_ptr__->field_2)._M_allocated_capacity =
                               CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                        local_260.field_2._M_local_buf[0]);
                          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
                               local_260.field_2._8_8_;
                        }
                        else {
                          (__return_storage_ptr__->_M_dataplus)._M_p = local_260._M_dataplus._M_p;
                          (__return_storage_ptr__->field_2)._M_allocated_capacity =
                               CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                        local_260.field_2._M_local_buf[0]);
                        }
                        psVar16 = &local_260._M_string_length;
                        __return_storage_ptr__->_M_string_length = local_260._M_string_length;
                        paVar18 = paVar1;
                        local_260._M_dataplus._M_p = (pointer)paVar1;
                        goto LAB_0050a3d7;
                      }
                      psVar14 = &context->Config;
                      bVar3 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                                        (local_2a8,&local_280,psVar14);
                      if (bVar3) {
                        context->HadContextSensitiveCondition = true;
                        pcVar17 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                            (local_2a8,&local_280,psVar14);
                        pcVar10 = "";
                        if (pcVar17 != (char *)0x0) {
                          pcVar10 = pcVar17;
                        }
                        (__return_storage_ptr__->_M_dataplus)._M_p =
                             (pointer)&__return_storage_ptr__->field_2;
                        sVar11 = strlen(pcVar10);
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)__return_storage_ptr__,pcVar10,pcVar10 + sVar11);
                      }
                      else {
                        bVar3 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                          (local_2a8,&local_280,psVar14);
                        if (!bVar3) goto LAB_0050a24a;
                        context->HadContextSensitiveCondition = true;
                        pcVar17 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                            (local_2a8,&local_280,psVar14);
                        pcVar10 = "";
                        if (pcVar17 != (char *)0x0) {
                          pcVar10 = pcVar17;
                        }
                        (__return_storage_ptr__->_M_dataplus)._M_p =
                             (pointer)&__return_storage_ptr__->field_2;
                        sVar11 = strlen(pcVar10);
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)__return_storage_ptr__,pcVar10,pcVar10 + sVar11);
                      }
                    }
                    else {
                      psVar14 = &context->Config;
                      bVar3 = cmGeneratorTarget::IsLinkInterfaceDependentBoolProperty
                                        (local_2a8,&local_280,psVar14);
                      if (bVar3) {
                        context->HadContextSensitiveCondition = true;
                        bVar3 = cmGeneratorTarget::GetLinkInterfaceDependentBoolProperty
                                          (local_2a8,&local_280,psVar14);
                        pcVar10 = "0";
                        if (bVar3) {
                          pcVar10 = "1";
                        }
                        (__return_storage_ptr__->_M_dataplus)._M_p =
                             (pointer)&__return_storage_ptr__->field_2;
                        pcVar17 = "";
                        if (bVar3) {
                          pcVar17 = "";
                        }
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)__return_storage_ptr__,pcVar10,pcVar17);
                      }
                      else {
                        bVar3 = cmGeneratorTarget::IsLinkInterfaceDependentStringProperty
                                          (local_2a8,&local_280,psVar14);
                        if (bVar3) {
                          context->HadContextSensitiveCondition = true;
                          pcVar17 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty
                                              (local_2a8,&local_280,psVar14);
                          pcVar10 = "";
                          if (pcVar17 != (char *)0x0) {
                            pcVar10 = pcVar17;
                          }
                          (__return_storage_ptr__->_M_dataplus)._M_p =
                               (pointer)&__return_storage_ptr__->field_2;
                          sVar11 = strlen(pcVar10);
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)__return_storage_ptr__,pcVar10,pcVar10 + sVar11);
                        }
                        else {
                          bVar3 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                                            (local_2a8,&local_280,psVar14);
                          if (bVar3) {
                            context->HadContextSensitiveCondition = true;
                            pcVar17 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                                (local_2a8,&local_280,psVar14);
                            pcVar10 = "";
                            if (pcVar17 != (char *)0x0) {
                              pcVar10 = pcVar17;
                            }
                            (__return_storage_ptr__->_M_dataplus)._M_p =
                                 (pointer)&__return_storage_ptr__->field_2;
                            sVar11 = strlen(pcVar10);
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)__return_storage_ptr__,pcVar10,pcVar10 + sVar11);
                          }
                          else {
                            bVar3 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                              (local_2a8,&local_280,psVar14);
                            if (!bVar3) goto LAB_0050a222;
                            context->HadContextSensitiveCondition = true;
                            pcVar17 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                                (local_2a8,&local_280,psVar14);
                            pcVar10 = "";
                            if (pcVar17 != (char *)0x0) {
                              pcVar10 = pcVar17;
                            }
                            (__return_storage_ptr__->_M_dataplus)._M_p =
                                 (pointer)&__return_storage_ptr__->field_2;
                            sVar11 = strlen(pcVar10);
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)__return_storage_ptr__,pcVar10,pcVar10 + sVar11);
                          }
                        }
                      }
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_260._M_dataplus._M_p != paVar1) {
                    operator_delete(local_260._M_dataplus._M_p,
                                    CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                             local_260.field_2._M_local_buf[0]) + 1);
                  }
                }
                cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
                          ((cmGeneratorExpressionDAGChecker *)local_1a8);
              }
            }
            else {
              bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                (dagCheckerParent,(cmGeneratorTarget *)0x0,ANY);
              if (!bVar4) {
                bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingIncludeDirectories
                                  (dagCheckerParent);
                if (((((!bVar4) &&
                      (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingSystemIncludeDirectories
                                         (dagCheckerParent), !bVar4)) &&
                     ((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingCompileDefinitions
                                         (dagCheckerParent), !bVar4 &&
                      ((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingCompileOptions
                                          (dagCheckerParent), !bVar4 &&
                       (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingAutoUicOptions
                                          (dagCheckerParent), !bVar4)))))) &&
                    (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagCheckerParent),
                    !bVar4)) &&
                   ((((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingCompileFeatures
                                         (dagCheckerParent), !bVar4 &&
                      (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkOptions
                                         (dagCheckerParent), !bVar4)) &&
                     (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkDirectories
                                        (dagCheckerParent), !bVar4)) &&
                    ((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkDepends
                                        (dagCheckerParent), !bVar4 &&
                     (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingPrecompileHeaders
                                        (dagCheckerParent), !bVar4)))))) {
                  __assert_fail("CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD( ASSERT_TRANSITIVE_PROPERTY_METHOD) false"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                                ,0x825,
                                "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                               );
                }
                goto LAB_00509e6e;
              }
              if (local_2a0._M_string_length == 0) {
                uVar19 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
                goto LAB_00509e70;
              }
              GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                        ((string *)local_1a8,content);
              local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_260,
                         "$<TARGET_PROPERTY:...> expression in link libraries evaluation depends on target property which is transitive over the link libraries, creating a recursion."
                         ,"");
              reportError(context,(string *)local_1a8,&local_260);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_260._M_dataplus._M_p != &local_260.field_2) {
                operator_delete(local_260._M_dataplus._M_p,
                                CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                         local_260.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._0_8_ != local_198) {
                operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
              }
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              __return_storage_ptr__->_M_string_length = 0;
              (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
              operator_delete(local_2a0._M_dataplus._M_p,
                              CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                       local_2a0.field_2._M_local_buf[0]) + 1);
            }
            goto LAB_00509b12;
          }
          TVar8 = cmGeneratorTarget::GetType(local_2a8);
          if (((dagCheckerParent == (cmGeneratorExpressionDAGChecker *)0x0) ||
              (TVar8 != STATIC_LIBRARY)) ||
             ((bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                 (dagCheckerParent,(cmGeneratorTarget *)0x0,ANY), !bVar3 &&
              (bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagCheckerParent), !bVar3)
              ))) {
            cmGeneratorTarget::GetLinkerLanguage(__return_storage_ptr__,local_2a8,&context->Config);
            goto LAB_00509b12;
          }
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2a0,
                     "LINKER_LANGUAGE target property can not be used while evaluating link libraries for a static library"
                     ,"");
          reportError(context,(string *)local_1a8,&local_2a0);
        }
        else {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2a0,"Property name not supported.","");
          reportError(context,(string *)local_1a8,&local_2a0);
        }
      }
    }
LAB_00509ac7:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,
                      CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                               local_2a0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
  }
  else {
    if (lVar9 != 2) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2a0,
                 "$<TARGET_PROPERTY:...> expression requires one or two parameters","");
      reportError(context,(string *)local_1a8,&local_2a0);
      goto LAB_00509ac7;
    }
    std::__cxx11::string::_M_assign((string *)&local_240);
    std::__cxx11::string::_M_assign((string *)&local_280);
    pcVar10 = GetErrorText(&local_240,&local_280);
    if (pcVar10 != (char *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      sVar11 = strlen(pcVar10);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,pcVar10,pcVar10 + sVar11)
      ;
      reportError(context,(string *)local_1a8,&local_2a0);
      goto LAB_00509ac7;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_string_length ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0xc) {
      iVar5 = bcmp(local_280._M_dataplus._M_p,"ALIAS_GLOBAL",0xc);
      if (iVar5 != 0) {
LAB_005096cd:
        local_2a8 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&local_240);
        if (local_2a8 == (cmGeneratorTarget *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_240._M_dataplus._M_p,
                               local_240._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" not found.",0xc);
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_2a0,content);
          std::__cxx11::stringbuf::str();
          reportError(context,&local_2a0,&local_260);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,
                            CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                     local_260.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p,
                            CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                     local_2a0.field_2._M_local_buf[0]) + 1);
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          goto LAB_00509b12;
        }
        std::
        _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
        ::_M_insert_unique<cmGeneratorTarget_const*const&>
                  ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                    *)&context->AllTargets,&local_2a8);
        goto LAB_00509702;
      }
      bVar3 = cmMakefile::IsAlias(context->LG->Makefile,&local_240);
      if (bVar3) {
        bVar3 = cmGlobalGenerator::IsAlias(context->LG->GlobalGenerator,&local_240);
        pcVar10 = "FALSE";
        if (bVar3) {
          pcVar10 = "TRUE";
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,pcVar10,pcVar10 + ((ulong)bVar3 ^ 5));
        goto LAB_00509b12;
      }
    }
    else {
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_280._M_string_length !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0xe) || (iVar5 = bcmp(local_280._M_dataplus._M_p,"ALIASED_TARGET",0xe), iVar5 != 0))
      goto LAB_005096cd;
      bVar3 = cmMakefile::IsAlias(context->LG->Makefile,&local_240);
      if ((bVar3) &&
         (pcVar13 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&local_240),
         pcVar13 != (cmGeneratorTarget *)0x0)) {
        psVar14 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar13);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar2 = (psVar14->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar14->_M_string_length);
        goto LAB_00509b12;
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_00509b12:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,
                    CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                             local_280.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,
                    CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                             local_240.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagCheckerParent) const override
  {
    static cmsys::RegularExpression propertyNameValidator("^[A-Za-z0-9_]+$");

    cmGeneratorTarget const* target = nullptr;
    std::string targetName;
    std::string propertyName;

    if (parameters.size() == 2) {
      targetName = parameters[0];
      propertyName = parameters[1];

      if (const char* e = GetErrorText(targetName, propertyName)) {
        reportError(context, content->GetOriginalExpression(), e);
        return std::string();
      }
      if (propertyName == "ALIASED_TARGET"_s) {
        if (context->LG->GetMakefile()->IsAlias(targetName)) {
          if (cmGeneratorTarget* tgt =
                context->LG->FindGeneratorTargetToUse(targetName)) {
            return tgt->GetName();
          }
        }
        return std::string();
      }
      if (propertyName == "ALIAS_GLOBAL"_s) {
        if (context->LG->GetMakefile()->IsAlias(targetName)) {
          return context->LG->GetGlobalGenerator()->IsAlias(targetName)
            ? "TRUE"
            : "FALSE";
        }
        return std::string();
      }
      target = context->LG->FindGeneratorTargetToUse(targetName);

      if (!target) {
        std::ostringstream e;
        e << "Target \"" << targetName << "\" not found.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
      context->AllTargets.insert(target);

    } else if (parameters.size() == 1) {
      target = context->HeadTarget;
      propertyName = parameters[0];

      // Keep track of the properties seen while processing.
      // The evaluation of the LINK_LIBRARIES generator expressions
      // will check this to ensure that properties have one consistent
      // value for all evaluations.
      context->SeenTargetProperties.insert(propertyName);

      context->HadHeadSensitiveCondition = true;
      if (!target) {
        reportError(
          context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  "
          "It may not be used with add_custom_command or add_custom_target.  "
          " "
          "Specify the target to read a property from using the "
          "$<TARGET_PROPERTY:tgt,prop> signature instead.");
        return std::string();
      }
    } else {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires one or two parameters");
      return std::string();
    }

    if (propertyName == "SOURCES") {
      context->SourceSensitiveTargets.insert(target);
    }

    if (propertyName.empty()) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires a non-empty property "
        "name.");
      return std::string();
    }

    if (!propertyNameValidator.find(propertyName)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Property name not supported.");
      return std::string();
    }

    assert(target);

    if (propertyName == "LINKER_LANGUAGE") {
      if (target->LinkLanguagePropagatesToDependents() && dagCheckerParent &&
          (dagCheckerParent->EvaluatingLinkLibraries() ||
           dagCheckerParent->EvaluatingSources())) {
        reportError(
          context, content->GetOriginalExpression(),
          "LINKER_LANGUAGE target property can not be used while evaluating "
          "link libraries for a static library");
        return std::string();
      }
      return target->GetLinkerLanguage(context->Config);
    }

    std::string interfacePropertyName;
    bool isInterfaceProperty = false;

#define POPULATE_INTERFACE_PROPERTY_NAME(prop)                                \
  if (propertyName == #prop) {                                                \
    interfacePropertyName = "INTERFACE_" #prop;                               \
  } else if (propertyName == "INTERFACE_" #prop) {                            \
    interfacePropertyName = "INTERFACE_" #prop;                               \
    isInterfaceProperty = true;                                               \
  } else

    CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(POPULATE_INTERFACE_PROPERTY_NAME)
    // Note that the above macro terminates with an else
    /* else */ if (cmHasLiteralPrefix(propertyName, "COMPILE_DEFINITIONS_")) {
      cmPolicies::PolicyStatus polSt =
        context->LG->GetPolicyStatus(cmPolicies::CMP0043);
      if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD) {
        interfacePropertyName = "INTERFACE_COMPILE_DEFINITIONS";
      }
    }
#undef POPULATE_INTERFACE_PROPERTY_NAME

    bool evaluatingLinkLibraries = false;

    if (dagCheckerParent) {
      if (dagCheckerParent->EvaluatingGenexExpression() ||
          dagCheckerParent->EvaluatingPICExpression()) {
        // No check required.
      } else if (dagCheckerParent->EvaluatingLinkLibraries()) {
        evaluatingLinkLibraries = true;
        if (!interfacePropertyName.empty()) {
          reportError(
            context, content->GetOriginalExpression(),
            "$<TARGET_PROPERTY:...> expression in link libraries "
            "evaluation depends on target property which is transitive "
            "over the link libraries, creating a recursion.");
          return std::string();
        }
      } else {
#define ASSERT_TRANSITIVE_PROPERTY_METHOD(METHOD) dagCheckerParent->METHOD() ||
        assert(CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD(
          ASSERT_TRANSITIVE_PROPERTY_METHOD) false); // NOLINT(clang-tidy)
#undef ASSERT_TRANSITIVE_PROPERTY_METHOD
      }
    }

    if (isInterfaceProperty) {
      return cmGeneratorExpression::StripEmptyListElements(
        target->EvaluateInterfaceProperty(propertyName, context,
                                          dagCheckerParent));
    }

    cmGeneratorExpressionDAGChecker dagChecker(
      context->Backtrace, target, propertyName, content, dagCheckerParent);

    switch (dagChecker.Check()) {
      case cmGeneratorExpressionDAGChecker::SELF_REFERENCE:
        dagChecker.ReportError(context, content->GetOriginalExpression());
        return std::string();
      case cmGeneratorExpressionDAGChecker::CYCLIC_REFERENCE:
        // No error. We just skip cyclic references.
        return std::string();
      case cmGeneratorExpressionDAGChecker::ALREADY_SEEN:
        // We handle transitive properties above.  For non-transitive
        // properties we accept repeats anyway.
      case cmGeneratorExpressionDAGChecker::DAG:
        break;
    }

    std::string result;
    bool haveProp = false;
    if (cmValue p = target->GetProperty(propertyName)) {
      result = *p;
      haveProp = true;
    } else if (evaluatingLinkLibraries) {
      return std::string();
    }

    if (!haveProp && !target->IsImported() &&
        target->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
      if (target->IsLinkInterfaceDependentBoolProperty(propertyName,
                                                       context->Config)) {
        context->HadContextSensitiveCondition = true;
        return target->GetLinkInterfaceDependentBoolProperty(propertyName,
                                                             context->Config)
          ? "1"
          : "0";
      }
      if (target->IsLinkInterfaceDependentStringProperty(propertyName,
                                                         context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentStringProperty(propertyName,
                                                          context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
    }

    if (!target->IsImported() && dagCheckerParent &&
        !dagCheckerParent->EvaluatingLinkLibraries()) {
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
    }

    if (!interfacePropertyName.empty()) {
      result = cmGeneratorExpression::StripEmptyListElements(
        this->EvaluateDependentExpression(result, context->LG, context, target,
                                          &dagChecker, target));
      std::string linkedTargetsContent = getLinkedTargetsContent(
        target, interfacePropertyName, context, &dagChecker);
      if (!linkedTargetsContent.empty()) {
        result += (result.empty() ? "" : ";") + linkedTargetsContent;
      }
    }
    return result;
  }